

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicksort.c
# Opt level: O1

void quicksort(string *a,size_t n)

{
  uchar *s2;
  string puVar1;
  bool bVar2;
  int pb;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  string *ppuVar9;
  long lVar10;
  uint uVar11;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar12;
  
LAB_0024fd04:
  if (9 < n) {
    iVar4 = (int)(n >> 1);
    iVar12 = (int)n;
    uVar11 = iVar12 - 1;
    iVar13 = 0;
    if (n < 0x29) {
      iVar3 = 0;
      uVar5 = uVar11;
    }
    else {
      pb = (int)(n >> 3);
      iVar3 = med3(0,pb,pb * 2,a);
      iVar4 = med3(iVar4 - pb,iVar4,iVar4 + pb,a);
      uVar5 = med3(uVar11 + pb * -2,uVar11 - pb,uVar11,a);
    }
    iVar4 = med3(iVar3,iVar4,uVar5,a);
    s2 = a[iVar4];
    uVar7 = 0;
    uVar5 = uVar11;
    do {
      lVar15 = (long)(int)uVar11;
      iVar4 = iVar13;
      if (iVar13 <= (int)uVar11) {
        lVar10 = (long)iVar13 + -1;
        do {
          iVar3 = scmp(a[lVar10 + 1],s2);
          iVar4 = iVar13;
          if (0 < iVar3) break;
          if (iVar3 == 0) {
            puVar1 = a[(int)uVar7];
            a[(int)uVar7] = a[lVar10 + 1];
            a[lVar10 + 1] = puVar1;
            uVar7 = uVar7 + 1;
          }
          iVar13 = iVar13 + 1;
          lVar10 = lVar10 + 1;
          iVar4 = uVar11 + 1;
        } while (lVar10 < lVar15);
      }
      lVar10 = (long)iVar4;
      bVar2 = (int)uVar11 < iVar4;
      if ((int)uVar11 < iVar4) goto LAB_0024fe8e;
      iVar13 = scmp(a[lVar15],s2);
      while (-1 < iVar13) {
        uVar11 = uVar11 - 1;
        if (iVar13 == 0) {
          puVar1 = a[lVar15];
          a[lVar15] = a[(int)uVar5];
          a[(int)uVar5] = puVar1;
          uVar5 = uVar5 - 1;
        }
        bVar2 = lVar15 <= lVar10;
        if (lVar15 <= lVar10) goto LAB_0024fe8e;
        iVar13 = scmp(a[lVar15 + -1],s2);
        lVar15 = lVar15 + -1;
      }
      uVar11 = (uint)lVar15;
      if (bVar2) goto LAB_0024fe8e;
      puVar1 = a[lVar10];
      a[lVar10] = a[(int)uVar11];
      a[(int)uVar11] = puVar1;
      iVar13 = iVar4 + 1;
      uVar11 = uVar11 - 1;
    } while( true );
  }
  if (1 < n) {
    uVar8 = 1;
    lVar10 = 2;
    lVar15 = lVar10;
LAB_0024ff79:
    do {
      iVar4 = scmp(a[lVar10 + -2],a[lVar10 + -1]);
      if (0 < iVar4) {
        puVar1 = a[lVar10 + -1];
        a[lVar10 + -1] = a[lVar10 + -2];
        a[lVar10 + -2] = puVar1;
        lVar10 = lVar10 + -1;
        if (1 < lVar10) goto LAB_0024ff79;
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar15 + 1;
      lVar15 = lVar10;
    } while (uVar8 != n);
  }
  return;
LAB_0024fe8e:
  uVar14 = iVar4 - uVar7;
  uVar6 = uVar14;
  if ((int)uVar7 < (int)uVar14) {
    uVar6 = uVar7;
  }
  if (0 < (int)uVar6) {
    lVar15 = (long)(int)uVar14;
    if ((long)(int)uVar7 < (long)(int)uVar14) {
      lVar15 = (long)(int)uVar7;
    }
    uVar8 = 0;
    do {
      puVar1 = a[uVar8];
      a[uVar8] = a[(lVar10 + uVar8) - lVar15];
      a[(lVar10 + uVar8) - lVar15] = puVar1;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  uVar11 = uVar5 - uVar11;
  uVar7 = ~uVar5 + iVar12;
  uVar5 = uVar7;
  if ((int)uVar11 < (int)uVar7) {
    uVar5 = uVar11;
  }
  if (0 < (int)uVar5) {
    lVar15 = (long)(int)uVar11;
    if ((long)(int)uVar7 < (long)(int)uVar11) {
      lVar15 = (long)(int)uVar7;
    }
    iVar4 = uVar5 + 1;
    ppuVar9 = a;
    do {
      puVar1 = ppuVar9[lVar10];
      ppuVar9[lVar10] = ppuVar9[iVar12 - lVar15];
      ppuVar9[iVar12 - lVar15] = puVar1;
      ppuVar9 = ppuVar9 + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  if (1 < (int)uVar14) {
    quicksort(a,(ulong)uVar14);
  }
  if ((int)uVar11 < 2) {
    return;
  }
  a = a + (int)(iVar12 - uVar11);
  n = (size_t)uVar11;
  goto LAB_0024fd04;
}

Assistant:

void quicksort(string a[], size_t n)
{
   int pa, pb, pc, pd, pl, pm, pn, r, s;
   string t;
   string pv;

   if (n < 10) {       /* Insertion sort on smallest arrays */
      for (pm = 1; pm < n; pm++)
         for (pl = pm; pl > 0 && scmp(a[pl-1], a[pl]) > 0; pl--)
            swap(a[pl], a[pl-1]);
      return;
   }
   pm = n/2;               /* Small arrays, middle element */
   if (n > 7) {
      pl = 0;
      pn = n-1;
      if (n > 40) {       /* Big arrays, pseudomedian of 9 */
         s = n/8;
         pl = med3(pl, pl+s, pl+2*s, a);
         pm = med3(pm-s, pm, pm+s, a);
         pn = med3(pn-2*s, pn-s, pn, a);
      }
      pm = med3(pl, pm, pn, a);      /* Mid-size, med of 3 */
   }
   pv = a[pm];
   pa = pb = 0;
   pc = pd = n-1;
   for (;;) {
      while (pb <= pc && (r = scmp(a[pb], pv)) <= 0) {
         if (r == 0) { swap(a[pa], a[pb]); pa++; }
         pb++;
      }
      while (pc >= pb && (r = scmp(a[pc], pv)) >= 0) {
         if (r == 0) { swap(a[pc], a[pd]); pd--; }
         pc--;
      }
      if (pb > pc) break;
      swap(a[pb], a[pc]);
      pb++;
      pc--;
   }
   pn = n;
   s = min(pa,  pb-pa   ); vecswap(0,  pb-s, s, a);
   s = min(pd-pc, pn-pd-1); vecswap(pb, pn-s, s, a);
   if ((s = pb-pa) > 1) quicksort(a,    s);
   if ((s = pd-pc) > 1) quicksort(&a[pn-s], s);
}